

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O2

bool __thiscall Rml::BaseXMLParser::PeekString(BaseXMLParser *this,char *string,bool consume)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  
  uVar3 = this->xml_index;
  iVar2 = this->line_number;
  iVar7 = 0;
  uVar6 = uVar3;
  while( true ) {
    cVar1 = string[iVar7];
    if (cVar1 == '\0') break;
    if ((this->xml_source)._M_string_length <= uVar6) goto LAB_00251b23;
    bVar5 = Look(this);
    if (bVar5 == 10) {
      this->line_number = this->line_number + 1;
    }
    if (((iVar7 != 0) || (0x20 < bVar5)) ||
       (iVar4 = 0, (0x100002600U >> ((ulong)bVar5 & 0x3f) & 1) == 0)) {
      if (bVar5 != string[iVar7]) goto LAB_00251b23;
      iVar4 = iVar7 + 1;
    }
    iVar7 = iVar4;
    uVar6 = this->xml_index + 1;
    this->xml_index = uVar6;
  }
  if (!consume || cVar1 != '\0') {
LAB_00251b23:
    this->xml_index = uVar3;
    this->line_number = iVar2;
  }
  return cVar1 == '\0';
}

Assistant:

bool BaseXMLParser::PeekString(const char* string, bool consume)
{
	const size_t start_index = xml_index;
	const int start_line = line_number;
	bool success = true;
	int i = 0;
	while (string[i])
	{
		if (AtEnd())
		{
			success = false;
			break;
		}

		const char c = Look();

		// Count line numbers
		if (c == '\n')
		{
			line_number++;
		}

		// Seek past all the whitespace if we haven't hit the initial character yet.
		if (i == 0 && StringUtilities::IsWhitespace(c))
		{
			Next();
		}
		else
		{
			if (c != string[i])
			{
				success = false;
				break;
			}

			i++;
			Next();
		}
	}

	// Set the index to the start index unless we are consuming.
	if (!consume || !success)
	{
		xml_index = start_index;
		line_number = start_line;
	}

	return success;
}